

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall
tinyusdz::crate::CrateReader::ReadArray<tinyusdz::Reference>
          (CrateReader *this,vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *d)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  uint64_t n;
  ostringstream ss_e;
  uint64_t local_1e0;
  long *local_1d8;
  long local_1c8 [2];
  undefined1 local_1b8 [112];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  _Alloc_hider local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  _Alloc_hider local_118;
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  bool local_b8;
  storage_t<tinyusdz::Path::PathType> local_b4;
  bool local_b0;
  double local_a8;
  double local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  local_98;
  vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>> *local_40;
  CrateReader *local_38;
  
  if (d != (vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *)0x0) {
    local_1e0 = 0;
    bVar2 = StreamReader::read8(this->_sr,&local_1e0);
    if (bVar2) {
      if ((this->_config).maxArrayElements < local_1e0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"ReadArray",9);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
        poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b8,0x5f2);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        pcVar7 = "Too many array elements.";
        lVar6 = 0x18;
      }
      else {
        uVar5 = local_1e0 * 0x150 + this->_memoryUsage;
        this->_memoryUsage = uVar5;
        if (uVar5 <= (this->_config).maxMemoryBudget) {
          bVar2 = local_1e0 == 0;
          if (bVar2) {
            return bVar2;
          }
          pcVar1 = local_1b8 + 0xf0;
          uVar5 = 0;
          local_40 = (vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>> *)d;
          local_38 = this;
          do {
            local_1b8._0_8_ = local_1b8 + 0x10;
            local_1b8._8_8_ = 0;
            local_1b8[0x10] = '\0';
            local_1b8._32_8_ = local_1b8 + 0x30;
            local_1b8._40_8_ = 0;
            local_1b8[0x30] = '\0';
            local_1b8._64_8_ = local_1b8 + 0x50;
            local_1b8._72_8_ = 0;
            local_1b8[0x50] = '\0';
            local_1b8._96_8_ = local_1b8 + 0x70;
            local_1b8._104_8_ = 0;
            local_148._M_local_buf[0] = '\0';
            local_138._M_p = local_1b8 + 0x90;
            local_130 = 0;
            local_128._M_local_buf[0] = '\0';
            local_118._M_p = local_1b8 + 0xb0;
            local_110 = 0;
            local_108._M_local_buf[0] = '\0';
            local_f8._M_p = local_1b8 + 0xd0;
            local_f0 = 0;
            local_e8._M_local_buf[0] = '\0';
            local_d0 = 0;
            local_c8._M_local_buf[0] = '\0';
            local_b8 = false;
            local_b4 = (storage_t<tinyusdz::Path::PathType>)0x0;
            local_b0 = false;
            local_a8 = 0.0;
            local_a0 = 1.0;
            local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_98._M_impl.super__Rb_tree_header._M_header._M_left =
                 (_Base_ptr)(local_1b8 + 0x128);
            local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_d8._M_p = pcVar1;
            local_98._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_98._M_impl.super__Rb_tree_header._M_header._M_left;
            bVar3 = ReadReference(local_38,(Reference *)local_1b8);
            if (!bVar3) {
              ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
              ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                          *)(local_1b8 + 0x120),
                         (_Link_type)local_98._M_impl.super__Rb_tree_header._M_header._M_parent);
              if (local_d8._M_p != pcVar1) {
                operator_delete(local_d8._M_p,
                                CONCAT71(local_c8._M_allocated_capacity._1_7_,
                                         local_c8._M_local_buf[0]) + 1);
              }
              if (local_f8._M_p != local_1b8 + 0xd0) {
                operator_delete(local_f8._M_p,
                                CONCAT71(local_e8._M_allocated_capacity._1_7_,
                                         local_e8._M_local_buf[0]) + 1);
              }
              if (local_118._M_p != local_1b8 + 0xb0) {
                operator_delete(local_118._M_p,
                                CONCAT71(local_108._M_allocated_capacity._1_7_,
                                         local_108._M_local_buf[0]) + 1);
              }
              if (local_138._M_p != local_1b8 + 0x90) {
                operator_delete(local_138._M_p,
                                CONCAT71(local_128._M_allocated_capacity._1_7_,
                                         local_128._M_local_buf[0]) + 1);
              }
              if ((undefined1 *)local_1b8._96_8_ != local_1b8 + 0x70) {
                operator_delete((void *)local_1b8._96_8_,
                                CONCAT71(local_148._M_allocated_capacity._1_7_,
                                         local_148._M_local_buf[0]) + 1);
              }
              if ((undefined1 *)local_1b8._64_8_ != local_1b8 + 0x50) {
                operator_delete((void *)local_1b8._64_8_,
                                CONCAT71(local_1b8._81_7_,local_1b8[0x50]) + 1);
              }
              if ((undefined1 *)local_1b8._32_8_ != local_1b8 + 0x30) {
                operator_delete((void *)local_1b8._32_8_,
                                CONCAT71(local_1b8._49_7_,local_1b8[0x30]) + 1);
              }
              if ((undefined1 *)local_1b8._0_8_ == local_1b8 + 0x10) {
                return bVar2;
              }
              operator_delete((void *)local_1b8._0_8_,CONCAT71(local_1b8._17_7_,local_1b8[0x10]) + 1
                             );
              return bVar2;
            }
            ::std::vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>>::
            emplace_back<tinyusdz::Reference&>(local_40,(Reference *)local_1b8);
            ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
            ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                        *)(local_1b8 + 0x120),
                       (_Link_type)local_98._M_impl.super__Rb_tree_header._M_header._M_parent);
            if (local_d8._M_p != pcVar1) {
              operator_delete(local_d8._M_p,
                              CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]
                                      ) + 1);
            }
            if (local_f8._M_p != local_1b8 + 0xd0) {
              operator_delete(local_f8._M_p,
                              CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]
                                      ) + 1);
            }
            if (local_118._M_p != local_1b8 + 0xb0) {
              operator_delete(local_118._M_p,
                              CONCAT71(local_108._M_allocated_capacity._1_7_,
                                       local_108._M_local_buf[0]) + 1);
            }
            if (local_138._M_p != local_1b8 + 0x90) {
              operator_delete(local_138._M_p,
                              CONCAT71(local_128._M_allocated_capacity._1_7_,
                                       local_128._M_local_buf[0]) + 1);
            }
            if ((undefined1 *)local_1b8._96_8_ != local_1b8 + 0x70) {
              operator_delete((void *)local_1b8._96_8_,
                              CONCAT71(local_148._M_allocated_capacity._1_7_,
                                       local_148._M_local_buf[0]) + 1);
            }
            if ((undefined1 *)local_1b8._64_8_ != local_1b8 + 0x50) {
              operator_delete((void *)local_1b8._64_8_,
                              CONCAT71(local_1b8._81_7_,local_1b8[0x50]) + 1);
            }
            if ((undefined1 *)local_1b8._32_8_ != local_1b8 + 0x30) {
              operator_delete((void *)local_1b8._32_8_,
                              CONCAT71(local_1b8._49_7_,local_1b8[0x30]) + 1);
            }
            if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
              operator_delete((void *)local_1b8._0_8_,CONCAT71(local_1b8._17_7_,local_1b8[0x10]) + 1
                             );
            }
            uVar5 = uVar5 + 1;
            bVar2 = uVar5 >= local_1e0;
          } while (uVar5 < local_1e0);
          return bVar2;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"ReadArray",9);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
        poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b8,0x5f5);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        pcVar7 = "Reached to max memory budget.";
        lVar6 = 0x1d;
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"ReadArray",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
      poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b8,0x5ed);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      pcVar7 = "Failed to read the number of array elements.";
      lVar6 = 0x2c;
    }
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,pcVar7,lVar6);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1d8);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
    ::std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x70));
  }
  return false;
}

Assistant:

bool CrateReader::ReadArray(std::vector<Reference> *d) {

  if (!d) {
    return false;
  }

  uint64_t n{0};
  if (!_sr->read8(&n)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
    return false;
  }

  if (n > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many array elements.");
  }

  CHECK_MEMORY_USAGE(sizeof(Reference) * n);

  for (size_t i = 0; i < n; i++) {
    Reference p;
    if (!ReadReference(&p)) {
      return false;
    }
    d->emplace_back(p);
  }

  return true;
}